

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupportTest.cpp
# Opt level: O2

void __thiscall
TEST_GROUP_CppUTestGroupMockSupportTest::~TEST_GROUP_CppUTestGroupMockSupportTest
          (TEST_GROUP_CppUTestGroupMockSupportTest *this)

{
  ~TEST_GROUP_CppUTestGroupMockSupportTest(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TEST_GROUP(MockSupportTest)
{
  MockExpectedCallsListForTest expectations;
  MockFailureReporterInstaller failureReporterInstaller;

  void teardown() _override
  {
      mock().checkExpectations();
      CHECK_NO_MOCK_FAILURE();
      MockFailureReporterForTest::clearReporter();
      mock().clear();
  }
}